

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

bool __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
::is_selected(list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
              *this,unsigned_long index)

{
  bool bVar1;
  auto_mutex M;
  auto_mutex local_30;
  
  local_30.r = (this->super_scrollable_region).super_drawable.m;
  local_30.m = (mutex *)0x0;
  local_30.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_30.r,1);
  bVar1 = (this->items).array_elements[index].is_selected;
  auto_mutex::unlock(&local_30);
  return bVar1;
}

Assistant:

bool list_box<S>::
    is_selected (
        unsigned long index
    ) const
    {
        auto_mutex M(m);
        DLIB_ASSERT ( index < size() ,
                "\tbool list_box::is_selected(index)"
                << "\n\tindex:  " << index 
                << "\n\tsize(): " << size() );

        return items[index].is_selected;
    }